

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O2

FieldMap * __thiscall FIX::FieldMap::operator=(FieldMap *this,FieldMap *rhs)

{
  std::vector<FIX::FieldBase,_std::allocator<FIX::FieldBase>_>::_M_move_assign
            (&this->m_fields,&rhs->m_fields);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
  ::operator=(&(this->m_groups)._M_t,&(rhs->m_groups)._M_t);
  message_order::operator=(&this->m_order,&rhs->m_order);
  return this;
}

Assistant:

FieldMap &FieldMap::operator=(FieldMap &&rhs) {
  m_fields = std::move(rhs.m_fields);
  m_groups = std::move(rhs.m_groups);
  m_order = std::move(rhs.m_order);
  return *this;
}